

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<_7648aab9_> * __thiscall
llvm::SmallVectorImpl<$7648aab9$>::operator=
          (SmallVectorImpl<_7648aab9_> *this,SmallVectorImpl<_7648aab9_> *RHS)

{
  iterator MinSize;
  iterator pUVar1;
  Unparsed *local_e0;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<_7648aab9_> *RHS_local;
  SmallVectorImpl<_7648aab9_> *this_local;
  
  if (this != RHS) {
    MinSize = (iterator)
              (((long)(RHS->super_SmallVectorTemplateBase<_5635df56_>).
                      super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.EndX -
               (long)(RHS->super_SmallVectorTemplateBase<_5635df56_>).
                     super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX) / 0x18
              );
    NewEnd = (iterator)
             (((long)(this->super_SmallVectorTemplateBase<_5635df56_>).
                     super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.EndX -
              (long)(this->super_SmallVectorTemplateBase<_5635df56_>).
                    super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX) / 0x18)
    ;
    if (NewEnd < MinSize) {
      pUVar1 = (iterator)
               SmallVectorTemplateCommon<$b117901$>::capacity
                         ((SmallVectorTemplateCommon<_b117901_> *)this);
      if (pUVar1 < MinSize) {
        SmallVectorTemplateBase<$5635df56$>::destroy_range
                  ((Unparsed *)
                   (this->super_SmallVectorTemplateBase<_5635df56_>).
                   super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX,
                   (Unparsed *)
                   (this->super_SmallVectorTemplateBase<_5635df56_>).
                   super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.EndX);
        SmallVectorTemplateCommon<$b117901$>::setEnd
                  ((SmallVectorTemplateCommon<_b117901_> *)this,
                   (Unparsed *)
                   (this->super_SmallVectorTemplateBase<_5635df56_>).
                   super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX);
        NewEnd = (iterator)0x0;
        SmallVectorTemplateBase<$5635df56$>::grow
                  (&this->super_SmallVectorTemplateBase<_5635df56_>,(size_t)MinSize);
      }
      else if (NewEnd != (iterator)0x0) {
        std::
        copy<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<390u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<391u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<374u,Fixpp::Type::Char>>,Fixpp::TagT<392u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<393u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<394u,Fixpp::Type::Int>>,Fixpp::TagT<395u,Fixpp::Type::Int>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<396u,Fixpp::Type::Float>,Fixpp::TagT<397u,Fixpp::Type::Float>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<___p::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>::Unparsed*>
                  ((Unparsed *)
                   (RHS->super_SmallVectorTemplateBase<_5635df56_>).
                   super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX,
                   (Unparsed *)
                   ((long)(RHS->super_SmallVectorTemplateBase<_5635df56_>).
                          super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX +
                   (long)NewEnd * 0x18),
                   (Unparsed *)
                   (this->super_SmallVectorTemplateBase<_5635df56_>).
                   super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX);
      }
      SmallVectorTemplateBase<$5635df56$>::uninitialized_copy<_62f1e89b_>
                ((Unparsed *)
                 ((long)(RHS->super_SmallVectorTemplateBase<_5635df56_>).
                        super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX +
                 (long)NewEnd * 0x18),
                 (Unparsed *)
                 (RHS->super_SmallVectorTemplateBase<_5635df56_>).
                 super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.EndX,
                 (Unparsed *)
                 ((long)(this->super_SmallVectorTemplateBase<_5635df56_>).
                        super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX +
                 (long)NewEnd * 0x18));
      SmallVectorTemplateCommon<$b117901$>::setEnd
                ((SmallVectorTemplateCommon<_b117901_> *)this,
                 (Unparsed *)
                 ((long)(this->super_SmallVectorTemplateBase<_5635df56_>).
                        super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX +
                 (long)MinSize * 0x18));
    }
    else {
      if (MinSize == (iterator)0x0) {
        local_e0 = (Unparsed *)
                   (this->super_SmallVectorTemplateBase<_5635df56_>).
                   super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX;
      }
      else {
        local_e0 = std::
                   copy<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<390u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<391u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<374u,Fixpp::Type::Char>>,Fixpp::TagT<392u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<393u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<394u,Fixpp::Type::Int>>,Fixpp::TagT<395u,Fixpp::Type::Int>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<396u,Fixpp::Type::Float>,Fixpp::TagT<397u,Fixpp::Type::Float>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<___p::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>::Unparsed*>
                             ((Unparsed *)
                              (RHS->super_SmallVectorTemplateBase<_5635df56_>).
                              super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.
                              BeginX,(Unparsed *)
                                     ((long)(RHS->super_SmallVectorTemplateBase<_5635df56_>).
                                            super_SmallVectorTemplateCommon<_b117901_>.
                                            super_SmallVectorBase.BeginX + (long)MinSize * 0x18),
                              (Unparsed *)
                              (this->super_SmallVectorTemplateBase<_5635df56_>).
                              super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.
                              BeginX);
      }
      SmallVectorTemplateBase<$5635df56$>::destroy_range
                (local_e0,(Unparsed *)
                          (this->super_SmallVectorTemplateBase<_5635df56_>).
                          super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.EndX);
      SmallVectorTemplateCommon<$b117901$>::setEnd
                ((SmallVectorTemplateCommon<_b117901_> *)this,local_e0);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}